

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdSetRange(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenGenericContext *pCVar1;
  int iVar2;
  CodeGenRegVmStateContext *num;
  uchar *puVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  x86Reg reg2;
  uint uVar9;
  undefined8 in_RAX;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool *pbVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  x86Size unaff_EBP;
  x86Size xVar17;
  RegVmCmd RVar19;
  RegVmCmd RVar20;
  RegVmCmd ctx_00;
  uint in_R9D;
  x86Size unaff_R12D;
  uint shift;
  long unaff_R13;
  undefined8 unaff_R14;
  uint *unaff_R15;
  undefined8 uStack_28;
  x86Command xVar18;
  
  puVar16 = (undefined8 *)&stack0xffffffffffffffe0;
  puVar15 = &uStack_28;
  if (5 < cmd.rB) {
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                  ,0x614,"void GenCodeCmdSetRange(CodeGenRegVmContext &, RegVmCmd)");
  }
  piVar10 = (int *)((ulong)cmd >> 8);
  uVar11 = (ulong)cmd >> 0x10 & 0xff;
  xVar17 = 0x33d8c0;
  uVar12 = (ulong)(int)(&switchD_0027eb7b::switchdataD_0033d8c0)[uVar11];
  lVar13 = (long)&switchD_0027eb7b::switchdataD_0033d8c0 + uVar12;
  shift = (uint)unaff_R13;
  uVar9 = cmd._1_4_;
  RVar20 = cmd;
  RVar19 = cmd;
  ctx_00 = (RegVmCmd)ctx;
  uStack_28 = in_RAX;
  switch(uVar11) {
  case 1:
switchD_0027eb7b_caseD_1:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_cvtsd2ss,rXMM0,sQWORD,rEBX,(uVar9 & 0xff) << 3);
    EMIT_OP_REG_REG(&ctx->ctx,o_movd,rEAX,rXMM0);
    goto LAB_0027ec0b;
  case 3:
switchD_0027eb7b_caseD_3:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar9 & 0xff) << 3);
LAB_0027ec0b:
    xVar18 = o_rep_stosd;
    break;
  case 4:
switchD_0027eb7b_caseD_4:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar9 & 0xff) << 3);
    xVar18 = o_rep_stosw;
    break;
  case 5:
switchD_0027eb7b_caseD_5:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar9 & 0xff) << 3);
    xVar18 = o_rep_stosb;
    break;
  case 6:
switchD_0027eb7b_caseD_6:
    *piVar10 = *piVar10 + uVar9;
    *(char *)((long)piVar10 + -0x7d) = *(char *)((long)piVar10 + -0x7d) + (char)lVar13;
    return;
  case 7:
switchD_0027eb7b_caseD_7:
    if ((int)in_R9D < 0) {
      unaff_EBP = sBYTE;
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,in_R9D);
      RVar19.code = 'M';
      RVar19.rA = '\0';
      RVar19.rB = '\0';
      RVar19.rC = '\0';
      RVar19.argument = 0;
      xVar17 = sQWORD;
      lVar13 = 7;
      ctx_00 = cmd;
      goto switchD_0027eb7b_caseD_a;
    }
    EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,in_R9D);
    goto LAB_0027f35b;
  case 8:
switchD_0027eb7b_caseD_8:
    out(0xd8c0,cmd.rA);
    EMIT_OP_RPTR_REG(&ctx->ctx,cmd._0_4_,unaff_R12D,rEBP,shift,unaff_EBP);
    goto LAB_0027f23a;
  case 9:
switchD_0027eb7b_caseD_9:
    uStack_28 = 0x27f2bd;
    EMIT_OP_RPTR_NUM(&ctx->ctx,(x86Command)in_RAX,sDWORD,rEBP,shift,in_R9D);
    puVar15 = (undefined8 *)&stack0xffffffffffffffe0;
    goto LAB_0027f23a;
  case 10:
switchD_0027eb7b_caseD_a:
    EMIT_OP_RPTR_REG((CodeGenGenericContext *)ctx_00,RVar19._0_4_,xVar17,(x86Reg)lVar13,shift,
                     unaff_EBP);
LAB_0027f35b:
    ctx = (CodeGenRegVmContext *)&ctx[-1].currFunctionId;
    puVar15 = &uStack_28;
LAB_0027f23a:
    pbVar14 = (bool *)((long)&(ctx->ctx).x86Base + 4);
    do {
      pCVar1 = (CodeGenGenericContext *)(pbVar14 + -0xc);
      if (*(int *)&pCVar1->x86Op == 1) {
        *(undefined8 *)((long)puVar15 + -8) = 0x4d;
        uVar5 = *(undefined8 *)((long)puVar15 + -8);
        *(undefined8 *)((long)puVar15 + -8) = 4;
        uVar6 = *(undefined8 *)((long)puVar15 + -8);
        *(undefined8 *)((long)puVar15 + -8) = 0xe;
        uVar7 = *(undefined8 *)((long)puVar15 + -8);
        xVar17 = (x86Size)uVar6;
        *(undefined8 *)((long)puVar15 + -8) = 0x27f43e;
        EMIT_OP_REG_RPTR((CodeGenGenericContext *)cmd,(x86Command)uVar5,xVar17,xVar17,(x86Reg)uVar7,
                         0x120);
        iVar2 = *(int *)((long)cmd + 0xa20);
        *(undefined8 *)((long)puVar15 + -8) = 1;
        uVar5 = *(undefined8 *)((long)puVar15 + -8);
        *(undefined8 *)((long)puVar15 + -8) = 3;
        uVar6 = *(undefined8 *)((long)puVar15 + -8);
        *(undefined8 *)((long)puVar15 + -8) = 0x27f45b;
        EMIT_OP_RPTR_NUM((CodeGenGenericContext *)cmd,(x86Command)uVar5,(x86Size)uVar6,xVar17,0,
                         iVar2 + 1);
        *(undefined8 *)((long)puVar15 + -8) = 0x4f;
        uVar5 = *(undefined8 *)((long)puVar15 + -8);
        *(undefined8 *)((long)puVar15 + -8) = 0x27f474;
        EMIT_OP_RPTR_NUM((CodeGenGenericContext *)cmd,(x86Command)uVar5,xVar17,(x86Reg)uVar7,0x120,
                         xVar17);
        return;
      }
      pbVar14 = pbVar14 + 4;
      uVar9 = *(int *)&pCVar1->x86Op - 2;
    } while (4 < uVar9);
    (*(code *)((long)(int)unaff_R15[uVar9] + (long)unaff_R15))();
    return;
  case 0xb:
switchD_0027eb7b_caseD_b:
    UINT_0033d8c8._0_1_ = (char)((ulong)lVar13 >> 8) + -0x43;
    goto LAB_0027fed9;
  case 0xc:
switchD_0027eb7b_caseD_c:
    do {
    } while( true );
  case 0xd:
switchD_0027eb7b_caseD_d:
    xVar17 = unaff_EBP;
    if (((ulong)cmd & 0x1400) == 0) {
      xVar18 = o_mov64;
      reg2 = rEBX;
      goto LAB_0028002c;
    }
    if (in_R9D == 2) {
      xVar18 = o_mov64;
      reg2 = rR14;
      goto LAB_0028002c;
    }
    if (in_R9D == 1) {
      RVar20.code = 'M';
      RVar20.rA = '\0';
      RVar20.rB = '\0';
      RVar20.rC = '\0';
      RVar20.argument = 0;
      goto switchD_0027eb7b_caseD_e;
    }
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,unaff_EBP,sQWORD,rEBX,in_R9D << 3);
    goto LAB_0028004c;
  case 0xe:
switchD_0027eb7b_caseD_e:
    xVar18 = RVar20._0_4_;
    reg2 = rR15;
LAB_0028002c:
    EMIT_OP_REG_REG(&ctx->ctx,xVar18,xVar17,reg2);
LAB_0028004c:
    puVar16 = &uStack_28;
    EMIT_OP_REG_NUM(&ctx->ctx,o_add64,unaff_EBP,(uint)unaff_R15);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rEDI,sQWORD,rEBP,unaff_R12D);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,(uint)((ulong)unaff_R14 >> 0x22));
    EMIT_OP(&ctx->ctx,unaff_EBP);
    unaff_R15 = &switchD_0027fefd::switchdataD_0033d8ec;
LAB_0027fed9:
    lVar13 = unaff_R13 + 0xc;
    do {
      piVar10 = (int *)(lVar13 + -0xc);
      if (*piVar10 == 7) {
        if (cmd.rC != '\0') {
          num = ctx->vmState;
          *(undefined8 *)((long)puVar16 + -8) = 0x4d;
          uVar5 = *(undefined8 *)((long)puVar16 + -8);
          *(undefined8 *)((long)puVar16 + -8) = 6;
          uVar6 = *(undefined8 *)((long)puVar16 + -8);
          *(undefined8 *)((long)puVar16 + -8) = 0x2800cc;
          EMIT_OP_REG_NUM64(&ctx->ctx,(x86Command)uVar5,(x86Reg)uVar6,(unsigned_long_long)num);
          *(undefined8 *)((long)puVar16 + -8) = 8;
          uVar7 = *(undefined8 *)((long)puVar16 + -8);
          *(undefined8 *)((long)puVar16 + -8) = 0x10;
          uVar8 = *(undefined8 *)((long)puVar16 + -8);
          *(undefined8 *)((long)puVar16 + -8) = 0x2800e1;
          EMIT_OP_REG_REG(&ctx->ctx,(x86Command)uVar5,(x86Reg)uVar7,(x86Reg)uVar8);
          *(undefined8 *)((long)puVar16 + -8) = 1;
          uVar5 = *(undefined8 *)((long)puVar16 + -8);
          *(undefined8 *)((long)puVar16 + -8) = 4;
          xVar17 = (x86Size)*(undefined8 *)((long)puVar16 + -8);
          *(undefined8 *)((long)puVar16 + -8) = 0x2800f7;
          EMIT_OP_REG_NUM(&ctx->ctx,(x86Command)uVar5,xVar17,*(uint *)((long)puVar16 + 0x10));
          *(undefined8 *)((long)puVar16 + -8) = 0x280102;
          EMIT_REG_READ(&ctx->ctx,(x86Reg)uVar7);
          *(undefined8 *)((long)puVar16 + -8) = 0x28010d;
          EMIT_REG_READ(&ctx->ctx,xVar17);
          *(undefined8 *)((long)puVar16 + -8) = 0x1a;
          uVar5 = *(undefined8 *)((long)puVar16 + -8);
          *(undefined8 *)((long)puVar16 + -8) = 0x280124;
          EMIT_OP_RPTR(&ctx->ctx,(x86Command)uVar5,xVar17,(x86Reg)uVar6,0xd8);
        }
        uVar9 = ctx->currInstructionRegKillOffset;
        puVar3 = ctx->exRegVmRegKillInfo;
        *(undefined8 *)((long)puVar16 + -8) = 0x280139;
        CodeGenGenericContext::KillEarlyUnreadRegVmRegisters(&ctx->ctx,puVar3 + uVar9);
        uVar9 = ctx->currInstructionRegKillOffset;
        puVar3 = ctx->exRegVmRegKillInfo;
        *(undefined8 *)((long)puVar16 + -8) = 0x28014e;
        CodeGenGenericContext::KillLateUnreadRegVmRegisters(&ctx->ctx,puVar3 + uVar9);
        *(undefined8 *)((long)puVar16 + -8) = 1;
        uVar5 = *(undefined8 *)((long)puVar16 + -8);
        *(undefined8 *)((long)puVar16 + -8) = 0x28015f;
        EMIT_OP_REG_NUM(&ctx->ctx,(x86Command)uVar5,(x86Command)uVar5,*(uint *)((long)puVar16 + 0xc)
                       );
        *(undefined8 *)((long)puVar16 + -8) = 0x4f;
        uVar5 = *(undefined8 *)((long)puVar16 + -8);
        *(undefined8 *)((long)puVar16 + -8) = 5;
        uVar6 = *(undefined8 *)((long)puVar16 + -8);
        *(undefined8 *)((long)puVar16 + -8) = 0x28;
        uVar7 = *(undefined8 *)((long)puVar16 + -8);
        *(undefined8 *)((long)puVar16 + -8) = 0x280170;
        EMIT_OP_REG_NUM(&ctx->ctx,(x86Command)uVar5,(x86Reg)uVar6,(uint)uVar7);
        *(undefined8 *)((long)puVar16 + -8) = 4;
        uVar5 = *(undefined8 *)((long)puVar16 + -8);
        *(undefined8 *)((long)puVar16 + -8) = 0x10;
        uVar6 = *(undefined8 *)((long)puVar16 + -8);
        *(undefined8 *)((long)puVar16 + -8) = 0x280180;
        EMIT_OP_REG(&ctx->ctx,(x86Command)uVar5,(x86Reg)uVar6);
        *(undefined8 *)((long)puVar16 + -8) = 2;
        uVar6 = *(undefined8 *)((long)puVar16 + -8);
        *(undefined8 *)((long)puVar16 + -8) = 0x28018d;
        EMIT_OP_REG(&ctx->ctx,(x86Command)uVar5,(x86Reg)uVar6);
        *(undefined8 *)((long)puVar16 + -8) = 0x1b;
        EMIT_OP(&ctx->ctx,(x86Command)*(undefined8 *)((long)puVar16 + -8));
        return;
      }
      lVar13 = lVar13 + 4;
      uVar9 = *piVar10 - 2;
    } while (4 < uVar9);
    (*(code *)((long)(int)unaff_R15[uVar9] + (long)unaff_R15))();
    return;
  case 0xf:
LAB_6a59036a:
    UINT_0033d8c8._0_1_ = 0xbd;
    halt_baddata();
  case 0x10:
switchD_0027eb7b_caseD_10:
    if (uVar12 == 0xffffffffffcc2741 || lVar13 != 0) {
      do {
      } while( true );
    }
    out(0xd8c0,cmd.rA);
    pcVar4 = *(code **)((long)piVar10 + 0x13fff41a);
    *(undefined8 *)
     ((ulong)(((int)&uStack_28 - cmd._0_4_) - (uint)(0xffffffffffcc273f < uVar12)) - 8) = 0x33d8ed;
    (*pcVar4)();
    do {
    } while( true );
  case 0x11:
switchD_0027eb7b_caseD_11:
    switch(uVar11) {
    case 1:
      goto switchD_0027eb7b_caseD_1;
    case 3:
      goto switchD_0027eb7b_caseD_3;
    case 4:
      goto switchD_0027eb7b_caseD_4;
    case 5:
      goto switchD_0027eb7b_caseD_5;
    case 6:
      goto switchD_0027eb7b_caseD_6;
    case 7:
      goto switchD_0027eb7b_caseD_7;
    case 8:
      goto switchD_0027eb7b_caseD_8;
    case 9:
      goto switchD_0027eb7b_caseD_9;
    case 10:
      goto switchD_0027eb7b_caseD_a;
    case 0xb:
      goto switchD_0027eb7b_caseD_b;
    case 0xc:
      goto switchD_0027eb7b_caseD_c;
    case 0xd:
      goto switchD_0027eb7b_caseD_d;
    case 0xe:
      goto switchD_0027eb7b_caseD_e;
    case 0xf:
      goto LAB_6a59036a;
    case 0x10:
      goto switchD_0027eb7b_caseD_10;
    case 0x11:
      goto switchD_0027eb7b_caseD_11;
    case 0x12:
      goto code_r0x0033d8c2;
    }
  default:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uVar9 & 0xff) << 3);
    xVar18 = o_rep_stosq;
    break;
  case 0x12:
code_r0x0033d8c2:
    do {
    } while( true );
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,cmd.argument);
  EMIT_OP(&ctx->ctx,xVar18);
  return;
}

Assistant:

void GenCodeCmdSetRange(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load double value as long
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load long value
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#else
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8);
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rA * 8 + 4);

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rECX, sDWORD, rEDI, cmd.argument * 8);

		EMIT_LABEL(ctx.ctx, ctx.labelCount);
		EMIT_OP_REG_REG(ctx.ctx, o_cmp, rEDI, rECX);
		EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount + 1, true);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 0, rEAX);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 4, rEDX);

		EMIT_OP_REG_NUM(ctx.ctx, o_add, rEDI, 8);
		EMIT_REG_READ(ctx.ctx, rEDI); // Mark that register is used (by next iteration)

		EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount, true);
		EMIT_LABEL(ctx.ctx, ctx.labelCount + 1);

		ctx.labelCount += 2;
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#endif
}